

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

void __thiscall cppnet::Address::Address(Address *this,AddressType at,string *ip,uint16_t port)

{
  this->_address_type = at;
  std::__cxx11::string::string((string *)&this->_ip,(string *)ip);
  this->_port = port;
  return;
}

Assistant:

Address::Address(AddressType at, const std::string& ip, uint16_t port):
    _address_type(at),
    _ip(ip),
    _port(port) {

}